

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICMakeFiles.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_92e9d4::CMakeFiles::Dump(Value *__return_storage_ptr__,CMakeFiles *this)

{
  Value *pVVar1;
  Value local_80;
  Value local_48;
  undefined1 local_19;
  CMakeFiles *local_18;
  CMakeFiles *this_local;
  Value *cmakeFiles;
  
  local_19 = 0;
  local_18 = this;
  this_local = (CMakeFiles *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  DumpPaths(&local_48,this);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  DumpInputs(&local_80,this);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"inputs");
  Json::Value::operator=(pVVar1,&local_80);
  Json::Value::~Value(&local_80);
  return __return_storage_ptr__;
}

Assistant:

Json::Value CMakeFiles::Dump()
{
  Json::Value cmakeFiles = Json::objectValue;
  cmakeFiles["paths"] = this->DumpPaths();
  cmakeFiles["inputs"] = DumpInputs();
  return cmakeFiles;
}